

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

int metacall_function_parameter_type(void *func,size_t parameter,metacall_value_id *id)

{
  metacall_value_id mVar1;
  signature s;
  size_t sVar2;
  type t;
  int iVar3;
  
  iVar3 = 1;
  mVar1 = METACALL_INVALID;
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    sVar2 = signature_count(s);
    if (parameter < sVar2) {
      t = signature_get_type(s,parameter);
      mVar1 = type_index(t);
      iVar3 = 0;
    }
  }
  *id = mVar1;
  return iVar3;
}

Assistant:

int metacall_function_parameter_type(void *func, size_t parameter, enum metacall_value_id *id)
{
	if (func != NULL)
	{
		function f = (function)func;
		signature s = function_signature(f);

		if (parameter < signature_count(s))
		{
			*id = type_index(signature_get_type(s, parameter));

			return 0;
		}
	}

	*id = METACALL_INVALID;

	return 1;
}